

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::saveSettings(QFileDialogPrivate *this)

{
  bool bVar1;
  int iVar2;
  QFileDialog *pQVar3;
  int *piVar4;
  QFileDialog *this_00;
  char *pcVar5;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  QMetaEnum *viewModeMeta;
  QString *path;
  QStringList *__range1;
  QFileDialog *q;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList history;
  QStringList historyUrls;
  QSettings settings;
  QSidebar *in_stack_fffffffffffffba8;
  QFileDialogPrivate *in_stack_fffffffffffffbb0;
  QVariant **size;
  char *in_stack_fffffffffffffbb8;
  QAnyStringView *in_stack_fffffffffffffbc0;
  QAnyStringView *this_01;
  QHeaderView *in_stack_fffffffffffffbc8;
  QList<QString> *in_stack_fffffffffffffbd8;
  QSplitter *in_stack_fffffffffffffbe8;
  QString *pQVar7;
  qsizetype in_stack_fffffffffffffc18;
  QLatin1String *local_378;
  QVariant *local_2c0;
  QLatin1String *local_2b0;
  QVariant *local_2a0;
  undefined1 local_290 [16];
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_27c;
  undefined1 local_278 [24];
  QVariant *local_260;
  QVariant *local_250 [2];
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_23c;
  QUrl local_238;
  undefined1 local_230 [24];
  QString *local_218;
  const_iterator local_210;
  const_iterator local_208;
  QList<QString> local_200;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  QByteArray local_1d0;
  QVariant *local_1b8;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_1a4;
  undefined1 local_1a0 [24];
  undefined1 local_188 [24];
  QVariant *local_170;
  QVariant *local_148;
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  undefined1 *local_f8;
  undefined1 *local_f0;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QAnyStringView local_88 [2];
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s
            ((char16_t *)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
  QString::QString((QString *)0x74e035);
  QSettings::QSettings
            ((QSettings *)&local_f8,UserScope,(QString *)local_110,(QString *)local_128,
             (QObject *)0x0);
  QString::~QString((QString *)0x74e066);
  QString::~QString((QString *)0x74e073);
  std::data<char_const,11ul>((char (*) [11])0xb2ef0d);
  QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x74e0c4);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (qsizetype)in_stack_fffffffffffffbb0);
  QSettings::beginGroup((QAnyStringView *)&local_f8);
  bVar1 = usingWidgets(in_stack_fffffffffffffbb0);
  if (bVar1) {
    std::data<char_const,13ul>((char (*) [13])"sidebarWidth");
    QtPrivate::lengthHelperContainer<char,13ul>((char (*) [13])0x74e160);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (qsizetype)in_stack_fffffffffffffbb0);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QSplitter::sizes(in_stack_fffffffffffffbe8);
    piVar4 = QList<int>::constFirst((QList<int> *)in_stack_fffffffffffffbb0);
    ::QVariant::QVariant(&local_28,*piVar4);
    QSettings::setValue((QAnyStringView *)&local_f8,local_148);
    ::QVariant::~QVariant(&local_28);
    QList<int>::~QList((QList<int> *)0x74e1f8);
    std::data<char_const,10ul>((char (*) [10])"shortcuts");
    QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])0x74e249);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (qsizetype)in_stack_fffffffffffffbb0);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QSidebar::urls(in_stack_fffffffffffffba8);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_1a4,PrettyDecoded);
    QUrl::toStringList((QList_conflict2 *)local_188,(QUrlTwoFlags_conflict *)local_1a0);
    ::QVariant::QVariant(&local_48,(QList_conflict2 *)local_188);
    QSettings::setValue((QAnyStringView *)&local_f8,local_170);
    ::QVariant::~QVariant(&local_48);
    QList<QString>::~QList((QList<QString> *)0x74e305);
    QList<QUrl>::~QList((QList<QUrl> *)0x74e312);
    std::data<char_const,15ul>((char (*) [15])"treeViewHeader");
    QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])0x74e363);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (qsizetype)in_stack_fffffffffffffbb0);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QTreeView::header((QTreeView *)in_stack_fffffffffffffbb0);
    QHeaderView::saveState(in_stack_fffffffffffffbc8);
    ::QVariant::QVariant(&local_68,&local_1d0);
    QSettings::setValue((QAnyStringView *)&local_f8,local_1b8);
    ::QVariant::~QVariant(&local_68);
    QByteArray::~QByteArray((QByteArray *)0x74e3ff);
  }
  local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x74e439);
  local_200.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_200.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_200.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::history((QFileDialog *)in_stack_fffffffffffffbc8);
  QList<QString>::size(&local_200);
  QList<QString>::reserve(in_stack_fffffffffffffbd8,in_stack_fffffffffffffc18);
  local_208.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_208 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffbb0);
  local_210.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_210 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffbb0);
  while( true ) {
    local_218 = local_210.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_208,local_210);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(&local_208);
    QUrl::fromLocalFile((QString *)&local_238);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_23c,PrettyDecoded);
    QUrl::toString((QUrlTwoFlags_conflict *)local_230);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffffbb0,(rvalue_ref)in_stack_fffffffffffffba8);
    QString::~QString((QString *)0x74e5b9);
    QUrl::~QUrl(&local_238);
    QList<QString>::const_iterator::operator++(&local_208);
  }
  size = local_250;
  this_00 = (QFileDialog *)std::data<char_const,8ul>((char (*) [8])"history");
  QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])0x74e623);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_fffffffffffffbc0,(char *)this_00,(qsizetype)size);
  this_01 = local_88;
  ::QVariant::QVariant((QVariant *)this_01,(QList_conflict2 *)&local_1e8);
  QSettings::setValue((QAnyStringView *)&local_f8,local_250[0]);
  ::QVariant::~QVariant((QVariant *)this_01);
  std::data<char_const,12ul>((char (*) [12])0xb2f05f);
  QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x74e6d6);
  QAnyStringView::QAnyStringView<char,_true>(this_01,(char *)this_00,(qsizetype)size);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *)
             in_stack_fffffffffffffba8);
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
            (&local_27c,PrettyDecoded);
  pQVar7 = (QString *)local_278;
  QUrl::toString((QUrlTwoFlags_conflict *)pQVar7);
  ::QVariant::QVariant(&local_a8,pQVar7);
  QSettings::setValue((QAnyStringView *)&local_f8,local_260);
  ::QVariant::~QVariant(&local_a8);
  QString::~QString((QString *)0x74e773);
  iVar2 = (*(code *)**(undefined8 **)&(pQVar3->super_QDialog).super_QWidget)();
  pcVar5 = (char *)(*(code *)**(undefined8 **)&(pQVar3->super_QDialog).super_QWidget)();
  QMetaObject::indexOfEnumerator(pcVar5);
  local_290 = QMetaObject::enumerator(iVar2);
  std::data<char_const,9ul>((char (*) [9])"viewMode");
  QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x74e830);
  QAnyStringView::QAnyStringView<char,_true>(this_01,(char *)this_00,(qsizetype)size);
  QFileDialog::viewMode(this_00);
  QMetaEnum::key((int)local_290);
  QLatin1String::QLatin1String((QLatin1String *)this_01,(char *)this_00);
  ::QVariant::QVariant(&local_c8,local_2b0);
  QSettings::setValue((QAnyStringView *)&local_f8,local_2a0);
  ::QVariant::~QVariant(&local_c8);
  std::data<char_const,10ul>((char (*) [10])"qtVersion");
  QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])0x74e911);
  QAnyStringView::QAnyStringView<char,_true>(this_01,(char *)this_00,(qsizetype)size);
  QVar6 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)size);
  local_378 = (QLatin1String *)QVar6.m_size;
  ::QVariant::QVariant(&local_e8,local_378);
  QSettings::setValue((QAnyStringView *)&local_f8,local_2c0);
  ::QVariant::~QVariant(&local_e8);
  QList<QString>::~QList((QList<QString> *)0x74e9a8);
  QList<QString>::~QList((QList<QString> *)0x74e9b5);
  QSettings::~QSettings((QSettings *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::saveSettings()
{
    Q_Q(QFileDialog);
    QSettings settings(QSettings::UserScope, u"QtProject"_s);
    settings.beginGroup("FileDialog");

    if (usingWidgets()) {
        settings.setValue("sidebarWidth", qFileDialogUi->splitter->sizes().constFirst());
        settings.setValue("shortcuts", QUrl::toStringList(qFileDialogUi->sidebar->urls()));
        settings.setValue("treeViewHeader", qFileDialogUi->treeView->header()->saveState());
    }
    QStringList historyUrls;
    const QStringList history = q->history();
    historyUrls.reserve(history.size());
    for (const QString &path : history)
        historyUrls << QUrl::fromLocalFile(path).toString();
    settings.setValue("history", historyUrls);
    settings.setValue("lastVisited", lastVisitedDir()->toString());
    const QMetaEnum &viewModeMeta = q->metaObject()->enumerator(q->metaObject()->indexOfEnumerator("ViewMode"));
    settings.setValue("viewMode", QLatin1StringView(viewModeMeta.key(q->viewMode())));
    settings.setValue("qtVersion", QT_VERSION_STR ""_L1);
}